

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

void jp2_destroy_decompress(opj_jp2_t *jp2)

{
  void *in_RDI;
  opj_j2k_t *in_stack_00000010;
  
  if (in_RDI != (void *)0x0) {
    j2k_destroy_decompress(in_stack_00000010);
    if (*(long *)((long)in_RDI + 0x50) != 0) {
      free(*(void **)((long)in_RDI + 0x50));
    }
    if (*(long *)((long)in_RDI + 0x48) != 0) {
      free(*(void **)((long)in_RDI + 0x48));
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void jp2_destroy_decompress(opj_jp2_t *jp2) {
	if(jp2) {
		/* destroy the J2K codec */
		j2k_destroy_decompress(jp2->j2k);

		if(jp2->comps) {
			opj_free(jp2->comps);
		}
		if(jp2->cl) {
			opj_free(jp2->cl);
		}
		opj_free(jp2);
	}
}